

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O0

wstring * __thiscall
PDA::Utils::Misc::toBase64_abi_cxx11_
          (wstring *__return_storage_ptr__,Misc *this,uchar *buffer,size_t size)

{
  undefined4 uVar1;
  wchar_t wVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  undefined4 *puVar5;
  wchar_t *pwVar6;
  size_t remainSize;
  size_t i;
  size_t di;
  uchar *s;
  allocator<wchar_t> local_2a;
  undefined1 local_29;
  ulong local_28;
  size_t base64Size;
  size_t size_local;
  uchar *buffer_local;
  wstring *result;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = ((ulong)(buffer + 2) / 3) * 3;
  uVar4 = SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
  local_29 = 0;
  local_28 = uVar4;
  base64Size = (size_t)buffer;
  size_local = (size_t)this;
  buffer_local = (uchar *)__return_storage_ptr__;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)__return_storage_ptr__,uVar4,L'A',&local_2a);
  std::allocator<wchar_t>::~allocator(&local_2a);
  di = size_local;
  for (remainSize = 0; remainSize < base64Size / 3; remainSize = remainSize + 1) {
    uVar1 = *(undefined4 *)((long)toBase64::base64Table + (ulong)(*(byte *)di & 0xfffffffc));
    puVar5 = (undefined4 *)std::__cxx11::wstring::operator[]((ulong)__return_storage_ptr__);
    *puVar5 = uVar1;
    wVar2 = toBase64::base64Table[(*(byte *)di & 3) << 4 | (uint)(*(byte *)(di + 1) >> 4)];
    pwVar6 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)__return_storage_ptr__);
    *pwVar6 = wVar2;
    wVar2 = toBase64::base64Table
            [(uint)(*(byte *)(di + 2) >> 6) + (uint)*(byte *)(di + 1) * 4 & 0x3f];
    pwVar6 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)__return_storage_ptr__);
    *pwVar6 = wVar2;
    wVar2 = toBase64::base64Table[*(byte *)(di + 2) & 0x3f];
    pwVar6 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)__return_storage_ptr__);
    *pwVar6 = wVar2;
    di = di + 3;
  }
  uVar4 = base64Size % 3;
  if (uVar4 != 0) {
    if (uVar4 == 1) {
      uVar1 = *(undefined4 *)((long)toBase64::base64Table + (ulong)(*(byte *)di & 0xfffffffc));
      puVar5 = (undefined4 *)std::__cxx11::wstring::operator[]((ulong)__return_storage_ptr__);
      *puVar5 = uVar1;
      wVar2 = toBase64::base64Table[((ulong)*(byte *)di & 3) * 0x10];
      pwVar6 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)__return_storage_ptr__);
      *pwVar6 = wVar2;
    }
    else if (uVar4 == 2) {
      uVar1 = *(undefined4 *)((long)toBase64::base64Table + (ulong)(*(byte *)di & 0xfffffffc));
      puVar5 = (undefined4 *)std::__cxx11::wstring::operator[]((ulong)__return_storage_ptr__);
      *puVar5 = uVar1;
      wVar2 = toBase64::base64Table[(*(byte *)di & 3) << 4 | (uint)(*(byte *)(di + 1) >> 4)];
      pwVar6 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)__return_storage_ptr__);
      *pwVar6 = wVar2;
      wVar2 = toBase64::base64Table[((ulong)*(byte *)(di + 1) & 0xf) * 4];
      pwVar6 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)__return_storage_ptr__);
      *pwVar6 = wVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring Misc::toBase64(unsigned char const* buffer, size_t size){
    using std::wstring;
    static wchar_t const* base64Table =
        L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

    size_t base64Size = (size + 2 - ((size + 2) % 3)) / 3 * 4;
    wstring result(base64Size, L'A');

    unsigned char const* s = buffer;  // source pointer
    size_t di = 0;                    // destination index
    for(size_t i = 0; i < size / 3; i++){
        // input: 0000_0000 0000_0000 0000_0000
        //
        // out1:  0000_00
        // out2:         00 0000
        // out3:                _0000 00
        // out4:                        00_0000

        result[di++] = base64Table[s[0] >> 2];
        result[di++] = base64Table[((s[0] << 4) | (s[1] >> 4)) & 0x3f];
        result[di++] = base64Table[((s[1] << 2) | (s[2] >> 6)) & 0x3f];
        result[di++] = base64Table[s[2] & 0x3f];
        s += 3;
    }

    size_t remainSize = size % 3;
    switch(remainSize){
    case 0:
        break;
    case 1:
        result[di++] = base64Table[s[0] >> 2];
        result[di++] = base64Table[(s[0] << 4) & 0x3f];
        break;
    case 2:
        result[di++] = base64Table[s[0] >> 2];
        result[di++] = base64Table[((s[0] << 4) | (s[1] >> 4)) & 0x3f];
        result[di++] = base64Table[(s[1] << 2) & 0x3f];
        break;
    }
    return result;
}